

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_FSA_non.c
# Opt level: O0

void PrintOutput(void *cvode_mem,sunrealtype t,N_Vector u)

{
  undefined4 uVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunrealtype hu;
  int retval;
  int qu;
  long nst;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffdc;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  uVar1 = CVodeGetNumSteps(in_RDI,&local_20);
  check_retval((void *)CONCAT44(in_stack_ffffffffffffffdc,uVar1),in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  uVar1 = CVodeGetLastOrder(local_8,&stack0xffffffffffffffdc);
  check_retval((void *)CONCAT44(in_stack_ffffffffffffffdc,uVar1),in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  uVar1 = CVodeGetLastStep(local_8,&stack0xffffffffffffffd0);
  check_retval((void *)CONCAT44(in_stack_ffffffffffffffdc,uVar1),in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  printf("%8.3e %2d  %8.3e %5ld\n",local_10,in_stack_ffffffffffffffd0,
         (ulong)in_stack_ffffffffffffffdc,local_20);
  printf("                                Solution       ");
  N_VMaxNorm(local_18);
  printf("%12.4e \n");
  return;
}

Assistant:

static void PrintOutput(void* cvode_mem, sunrealtype t, N_Vector u)
{
  long int nst;
  int qu, retval;
  sunrealtype hu;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetLastOrder(cvode_mem, &qu);
  check_retval(&retval, "CVodeGetLastOrder", 1);
  retval = CVodeGetLastStep(cvode_mem, &hu);
  check_retval(&retval, "CVodeGetLastStep", 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%8.3Le %2d  %8.3Le %5ld\n", t, qu, hu, nst);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%8.3e %2d  %8.3e %5ld\n", t, qu, hu, nst);
#else
  printf("%8.3e %2d  %8.3e %5ld\n", t, qu, hu, nst);
#endif

  printf("                                Solution       ");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le \n", N_VMaxNorm(u));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e \n", N_VMaxNorm(u));
#else
  printf("%12.4e \n", N_VMaxNorm(u));
#endif
}